

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual.h
# Opt level: O0

uint GetVirtualIndex(PClass *cls,char *funcname)

{
  DObject *p;
  Variant *pVVar1;
  FName local_24;
  uint VIndex;
  PFunction *sym;
  char *funcname_local;
  PClass *cls_local;
  
  sym = (PFunction *)funcname;
  funcname_local = (char *)cls;
  FName::FName(&local_24,funcname);
  p = (DObject *)
      PSymbolTable::FindSymbol
                (&(cls->super_PNativeStruct).super_PStruct.super_PNamedType.super_PCompoundType.
                  super_PType.Symbols,&local_24,false);
  _VIndex = dyn_cast<PFunction>(p);
  if (_VIndex != (PFunction *)0x0) {
    pVVar1 = TArray<PFunction::Variant,_PFunction::Variant>::operator[](&_VIndex->Variants,0);
    return pVVar1->Implementation->VirtualIndex;
  }
  __assert_fail("sym != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/virtual.h"
                ,5,"unsigned int GetVirtualIndex(PClass *, const char *)");
}

Assistant:

inline unsigned GetVirtualIndex(PClass *cls, const char *funcname)
{
	// Look up the virtual function index in the defining class because this may have gotten overloaded in subclasses with something different than a virtual override.
	auto sym = dyn_cast<PFunction>(cls->Symbols.FindSymbol(funcname, false));
	assert(sym != nullptr);
	auto VIndex = sym->Variants[0].Implementation->VirtualIndex;
	return VIndex;
}